

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_RH_ENDORSEMENT_Unmarshal
                 (TPMI_RH_ENDORSEMENT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    UVar2 = ByteArrayToUint32(*buffer);
    *target = UVar2;
    *buffer = *buffer + 4;
    if ((*target == 0x4000000b) || ((TVar3 = 0x84, *target == 0x40000007 && (flag != 0)))) {
      TVar3 = 0;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMI_RH_ENDORSEMENT_Unmarshal(TPMI_RH_ENDORSEMENT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_ENDORSEMENT:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}